

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyFindContainer(Node *node)

{
  Bool BVar1;
  
  if (node != (Node *)0x0) goto LAB_001442cf;
  node = (Node *)0x0;
  while( true ) {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    BVar1 = prvTidynodeHasCM(node,0x10);
    if (BVar1 == no) break;
LAB_001442cf:
    node = node->parent;
  }
  return node;
}

Assistant:

Node* TY_(FindContainer)( Node* node )
{
    for ( node = (node ? node->parent : NULL);
          node && TY_(nodeHasCM)(node, CM_INLINE);
          node = node->parent )
        /**/;

    return node;
}